

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

int pybind11::detail::generic_type::getbuffer(PyObject *obj,Py_buffer *view,int flags)

{
  long *plVar1;
  long *plVar2;
  int iVar3;
  type_info *ptVar4;
  buffer_info *pbVar5;
  Py_ssize_t PVar6;
  long *plVar7;
  
  ptVar4 = get_type_info(obj->ob_type);
  if ((ptVar4 == (type_info *)0x0 || (obj == (PyObject *)0x0 || view == (Py_buffer *)0x0)) ||
     (ptVar4->get_buffer == (_func_buffer_info_ptr_PyObject_ptr_void_ptr *)0x0)) {
    if (view != (Py_buffer *)0x0) {
      view->obj = (PyObject *)0x0;
    }
    PyErr_SetString(_PyExc_BufferError,"generic_type::getbuffer(): Internal error");
    iVar3 = -1;
  }
  else {
    view->suboffsets = (Py_ssize_t *)0x0;
    view->internal = (void *)0x0;
    view->shape = (Py_ssize_t *)0x0;
    view->strides = (Py_ssize_t *)0x0;
    view->readonly = 0;
    view->ndim = 0;
    view->format = (char *)0x0;
    view->len = 0;
    view->itemsize = 0;
    view->buf = (void *)0x0;
    view->obj = (PyObject *)0x0;
    pbVar5 = (*ptVar4->get_buffer)(obj,ptVar4->get_buffer_data);
    view->obj = obj;
    view->ndim = 1;
    view->internal = pbVar5;
    view->buf = *(void **)pbVar5;
    PVar6 = *(Py_ssize_t *)(pbVar5 + 8);
    view->itemsize = PVar6;
    view->len = PVar6;
    plVar1 = *(long **)(pbVar5 + 0x40);
    plVar2 = *(long **)(pbVar5 + 0x48);
    if (plVar1 != plVar2) {
      PVar6 = view->len;
      plVar7 = plVar1;
      do {
        PVar6 = PVar6 * *plVar7;
        view->len = PVar6;
        plVar7 = plVar7 + 1;
      } while (plVar7 != plVar2);
    }
    if ((flags & 4U) != 0) {
      view->format = *(char **)(pbVar5 + 0x18);
    }
    if ((~flags & 0x18U) == 0) {
      view->ndim = *(int *)(pbVar5 + 0x38);
      view->strides = *(Py_ssize_t **)(pbVar5 + 0x58);
      view->shape = plVar1;
    }
    obj->ob_refcnt = obj->ob_refcnt + 1;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int getbuffer(PyObject *obj, Py_buffer *view, int flags) {
        auto tinfo = detail::get_type_info(Py_TYPE(obj));
        if (view == nullptr || obj == nullptr || !tinfo || !tinfo->get_buffer) {
            if (view)
                view->obj = nullptr;
            PyErr_SetString(PyExc_BufferError, "generic_type::getbuffer(): Internal error");
            return -1;
        }
        memset(view, 0, sizeof(Py_buffer));
        buffer_info *info = tinfo->get_buffer(obj, tinfo->get_buffer_data);
        view->obj = obj;
        view->ndim = 1;
        view->internal = info;
        view->buf = info->ptr;
        view->itemsize = (ssize_t) info->itemsize;
        view->len = view->itemsize;
        for (auto s : info->shape)
            view->len *= s;
        if ((flags & PyBUF_FORMAT) == PyBUF_FORMAT)
            view->format = const_cast<char *>(info->format.c_str());
        if ((flags & PyBUF_STRIDES) == PyBUF_STRIDES) {
            view->ndim = (int) info->ndim;
            view->strides = (ssize_t *) &info->strides[0];
            view->shape = (ssize_t *) &info->shape[0];
        }
        Py_INCREF(view->obj);
        return 0;
    }